

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::jobJsonFile(Config *this,string *parameter)

{
  QPDFJob *this_00;
  undefined1 auVar1 [16];
  exception *e;
  string local_38;
  string *local_18;
  string *parameter_local;
  Config *this_local;
  
  this_00 = this->o;
  local_18 = parameter;
  parameter_local = (string *)this;
  auVar1 = std::__cxx11::string::c_str();
  QUtil::read_file_into_string_abi_cxx11_(&local_38,auVar1._0_8_,auVar1._8_8_);
  initializeFromJson(this_00,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jobJsonFile(std::string const& parameter)
{
    try {
        o.initializeFromJson(QUtil::read_file_into_string(parameter.c_str()), true);
    } catch (std::exception& e) {
        throw std::runtime_error(
            "error with job-json file " + std::string(parameter) + ": " + e.what() + "\nRun " +
            this->o.m->message_prefix + " --job-json-help for information on the file format.");
    }
    return this;
}